

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O0

uint * Aig_ManCutTruthOne(Aig_Obj_t *pNode,uint *pTruth,int nWords)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_34;
  int i;
  uint *pTruth1;
  uint *pTruth0;
  int nWords_local;
  uint *pTruth_local;
  Aig_Obj_t *pNode_local;
  
  pAVar4 = Aig_ObjFanin0(pNode);
  pvVar1 = (pAVar4->field_5).pData;
  pAVar4 = Aig_ObjFanin1(pNode);
  pvVar2 = (pAVar4->field_5).pData;
  iVar3 = Aig_ObjIsExor(pNode);
  if (iVar3 == 0) {
    iVar3 = Aig_ObjFaninC0(pNode);
    if ((iVar3 == 0) && (iVar3 = Aig_ObjFaninC1(pNode), iVar3 == 0)) {
      for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
        pTruth[local_34] =
             *(uint *)((long)pvVar1 + (long)local_34 * 4) &
             *(uint *)((long)pvVar2 + (long)local_34 * 4);
      }
    }
    else {
      iVar3 = Aig_ObjFaninC0(pNode);
      if ((iVar3 == 0) && (iVar3 = Aig_ObjFaninC1(pNode), iVar3 != 0)) {
        for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
          pTruth[local_34] =
               *(uint *)((long)pvVar1 + (long)local_34 * 4) &
               (*(uint *)((long)pvVar2 + (long)local_34 * 4) ^ 0xffffffff);
        }
      }
      else {
        iVar3 = Aig_ObjFaninC0(pNode);
        if ((iVar3 == 0) || (iVar3 = Aig_ObjFaninC1(pNode), iVar3 != 0)) {
          for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
            pTruth[local_34] =
                 (*(uint *)((long)pvVar1 + (long)local_34 * 4) ^ 0xffffffff) &
                 (*(uint *)((long)pvVar2 + (long)local_34 * 4) ^ 0xffffffff);
          }
        }
        else {
          for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
            pTruth[local_34] =
                 (*(uint *)((long)pvVar1 + (long)local_34 * 4) ^ 0xffffffff) &
                 *(uint *)((long)pvVar2 + (long)local_34 * 4);
          }
        }
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
      pTruth[local_34] =
           *(uint *)((long)pvVar1 + (long)local_34 * 4) ^
           *(uint *)((long)pvVar2 + (long)local_34 * 4);
    }
  }
  return pTruth;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes truth table of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
unsigned * Aig_ManCutTruthOne( Aig_Obj_t * pNode, unsigned * pTruth, int nWords )
{
    unsigned * pTruth0, * pTruth1;
    int i;
    pTruth0 = (unsigned *)Aig_ObjFanin0(pNode)->pData;
    pTruth1 = (unsigned *)Aig_ObjFanin1(pNode)->pData;
    if ( Aig_ObjIsExor(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}